

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_ellswift_xdh
              (secp256k1_context *ctx,uchar *output,uchar *ell_a64,uchar *ell_b64,uchar *seckey32,
              int party,secp256k1_ellswift_xdh_hash_function hashfp,void *data)

{
  ulong uVar1;
  int iVar2;
  uchar *a;
  secp256k1_fe xd;
  uchar sx [32];
  secp256k1_scalar s;
  secp256k1_fe px;
  secp256k1_fe t;
  secp256k1_fe u;
  secp256k1_fe xn;
  uint local_14c;
  uchar *local_148;
  secp256k1_fe local_140;
  uchar local_118 [32];
  secp256k1_scalar local_f8;
  secp256k1_fe local_d8;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  if (output == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_5();
  }
  else if (ell_a64 == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_4();
  }
  else if (ell_b64 == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_3();
  }
  else if (seckey32 == (uchar *)0x0) {
    secp256k1_ellswift_xdh_cold_2();
  }
  else {
    if (hashfp != (secp256k1_ellswift_xdh_hash_function)0x0) {
      a = ell_a64;
      if (party == 0) {
        a = ell_b64;
      }
      local_148 = output;
      secp256k1_fe_impl_set_b32_mod(&local_80,a);
      secp256k1_fe_impl_set_b32_mod(&local_a8,a + 0x20);
      secp256k1_ellswift_xswiftec_frac_var(&local_58,&local_140,&local_80,&local_a8);
      secp256k1_scalar_set_b32(&local_f8,seckey32,(int *)&local_14c);
      local_14c = (uint)(((local_f8.d[1] == 0 && local_f8.d[0] == 0) && local_f8.d[2] == 0) &&
                        local_f8.d[3] == 0);
      local_d8.n[0] = CONCAT44(local_d8.n[0]._4_4_,local_14c);
      uVar1 = (long)(int)local_14c - 1;
      local_f8.d[0] = (ulong)local_14c | local_f8.d[0] & uVar1;
      local_f8.d[1] = local_f8.d[1] & uVar1;
      local_f8.d[2] = local_f8.d[2] & uVar1;
      local_f8.d[3] = uVar1 & local_f8.d[3];
      secp256k1_ecmult_const_xonly(&local_d8,&local_58,&local_140,&local_f8,1);
      secp256k1_fe_impl_normalize(&local_d8);
      secp256k1_fe_impl_get_b32(local_118,&local_d8);
      iVar2 = (*hashfp)(local_148,local_118,ell_a64,ell_b64,data);
      return (uint)(local_14c == 0 && iVar2 != 0);
    }
    secp256k1_ellswift_xdh_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ellswift_xdh(const secp256k1_context *ctx, unsigned char *output, const unsigned char *ell_a64, const unsigned char *ell_b64, const unsigned char *seckey32, int party, secp256k1_ellswift_xdh_hash_function hashfp, void *data) {
    int ret = 0;
    int overflow;
    secp256k1_scalar s;
    secp256k1_fe xn, xd, px, u, t;
    unsigned char sx[32];
    const unsigned char* theirs64;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(output != NULL);
    ARG_CHECK(ell_a64 != NULL);
    ARG_CHECK(ell_b64 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(hashfp != NULL);

    /* Load remote public key (as fraction). */
    theirs64 = party ? ell_a64 : ell_b64;
    secp256k1_fe_set_b32_mod(&u, theirs64);
    secp256k1_fe_set_b32_mod(&t, theirs64 + 32);
    secp256k1_ellswift_xswiftec_frac_var(&xn, &xd, &u, &t);

    /* Load private key (using one if invalid). */
    secp256k1_scalar_set_b32(&s, seckey32, &overflow);
    overflow = secp256k1_scalar_is_zero(&s);
    secp256k1_scalar_cmov(&s, &secp256k1_scalar_one, overflow);

    /* Compute shared X coordinate. */
    secp256k1_ecmult_const_xonly(&px, &xn, &xd, &s, 1);
    secp256k1_fe_normalize(&px);
    secp256k1_fe_get_b32(sx, &px);

    /* Invoke hasher */
    ret = hashfp(output, sx, ell_a64, ell_b64, data);

    secp256k1_memclear(sx, sizeof(sx));
    secp256k1_fe_clear(&px);
    secp256k1_scalar_clear(&s);

    return !!ret & !overflow;
}